

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::SetViewportId(ON_Viewport *this,ON_UUID *id)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  bool bVar3;
  int iVar4;
  bool local_19;
  bool rc;
  ON_UUID *id_local;
  ON_Viewport *this_local;
  
  iVar4 = memcmp(&this->m_viewport_id,id,0x10);
  local_19 = iVar4 == 0;
  if ((!local_19) && (bVar3 = ::operator==(&this->m_viewport_id,&ON_nil_uuid), bVar3)) {
    uVar1 = id->Data2;
    uVar2 = id->Data3;
    (this->m_viewport_id).Data1 = id->Data1;
    (this->m_viewport_id).Data2 = uVar1;
    (this->m_viewport_id).Data3 = uVar2;
    *(undefined8 *)(this->m_viewport_id).Data4 = *(undefined8 *)id->Data4;
    local_19 = true;
  }
  return local_19;
}

Assistant:

bool ON_Viewport::SetViewportId( const ON_UUID& id)
{
  // Please discuss any code changes with Dale Lear.
  // You should NEVER change the viewport id once
  // it is set.
  bool rc = (0 == memcmp(&m_viewport_id,&id,sizeof(m_viewport_id)));
  if ( !rc && m_viewport_id == ON_nil_uuid )
  {  
    m_viewport_id = id;
    rc = true;
  }
  return rc;
}